

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformation_t * opengv::absolute_pose::epnp(AbsoluteAdapterBase *adapter,Indices *indices)

{
  double X;
  double Y;
  double Z;
  double x;
  double y;
  ulong uVar1;
  long *plVar2;
  int iVar3;
  size_t sVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Epnp *this;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *this_00;
  Indices *in_RDX;
  long *in_RSI;
  transformation_t *in_RDI;
  int c;
  int r;
  translation_t translation;
  rotation_t rotation;
  double t_epnp [3];
  double R_epnp [3] [3];
  bearingVector_t f;
  point_t p;
  size_t i;
  Epnp PnP;
  transformation_t *transformation;
  Index in_stack_fffffffffffffc48;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *in_stack_fffffffffffffc50;
  Indices *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc78;
  Scalar SVar7;
  Epnp *in_stack_fffffffffffffc80;
  int local_250;
  int local_24c;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_1e8;
  Scalar local_1e0;
  DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *local_1d8;
  Scalar local_1c8 [10];
  undefined1 local_178 [24];
  undefined1 local_160 [24];
  ulong local_148;
  Epnp local_130;
  Indices *local_18;
  long *local_10;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  modules::Epnp::Epnp(&local_130);
  Indices::size(local_18);
  modules::Epnp::set_maximum_number_of_correspondences(in_stack_fffffffffffffc80,iVar3);
  modules::Epnp::reset_correspondences(&local_130);
  local_148 = 0;
  while( true ) {
    uVar1 = local_148;
    sVar4 = Indices::size(local_18);
    plVar2 = local_10;
    if (sVar4 <= uVar1) break;
    iVar3 = Indices::operator[](in_stack_fffffffffffffc58,
                                (int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
    (**(code **)(*plVar2 + 0x30))(local_160,plVar2,(long)iVar3);
    plVar2 = local_10;
    iVar3 = Indices::operator[](in_stack_fffffffffffffc58,
                                (int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
    (**(code **)(*plVar2 + 0x10))(local_178,plVar2,(long)iVar3);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    X = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    Y = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    Z = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    x = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    y = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    modules::Epnp::add_correspondence(&local_130,X,Y,Z,x,y,*pSVar5);
    local_148 = local_148 + 1;
  }
  modules::Epnp::compute_pose((Epnp *)adapter,(double (*) [3])indices,(double *)PnP.cws_determinant)
  ;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x71d952);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x71d961);
  for (local_24c = 0; local_24c < 3; local_24c = local_24c + 1) {
    for (local_250 = 0; local_250 < 3; local_250 = local_250 + 1) {
      SVar7 = local_1c8[(long)local_24c * 3 + (long)local_250];
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,0x71d9c5);
      *pSVar6 = SVar7;
    }
  }
  this = (Epnp *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  this->uc = (double)local_1e8;
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                     in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  *(Scalar *)other = local_1e0;
  this_00 = (Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                       in_stack_fffffffffffffc50,(Index)local_1d8);
  ((plain_array<double,_3,_0,_0> *)
  &(this_00->super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>).
   super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>)->array[0] =
       (double)local_1d8;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transposeInPlace
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x71dab5);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-(local_1e8);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)local_1e8,other);
  Eigen::Matrix<double,3,1,0,3,1>::operator=((Matrix<double,_3,_1,_0,_3,_1> *)this_00,local_1d8);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x71db11);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)other,(Index)local_1e0);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
            (this_00,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1d8);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)other,(Index)local_1e0,
             (Index)this_00);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)this_00,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1d8);
  modules::Epnp::~Epnp(this);
  return in_RDI;
}

Assistant:

transformation_t epnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  //starting from 4 points, we have a unique solution
  assert(indices.size() > 5);

  modules::Epnp PnP;
  PnP.set_maximum_number_of_correspondences(indices.size());
  PnP.reset_correspondences();

  for( size_t i = 0; i < indices.size(); i++ )
  {
    point_t p = adapter.getPoint(indices[i]);
    bearingVector_t f = adapter.getBearingVector(indices[i]);
    PnP.add_correspondence(p[0], p[1], p[2], f[0], f[1], f[2]);
  }

  double R_epnp[3][3], t_epnp[3];
  PnP.compute_pose(R_epnp, t_epnp);

  rotation_t rotation;
  translation_t translation;

  for(int r = 0; r < 3; r++)
  {
    for(int c = 0; c < 3; c++)
      rotation(r,c) = R_epnp[r][c];
  }

  translation[0] = t_epnp[0];
  translation[1] = t_epnp[1];
  translation[2] = t_epnp[2];

  //take inverse transformation
  rotation.transposeInPlace();
  translation = -rotation * translation;

  transformation_t transformation;
  transformation.col(3) = translation;
  transformation.block<3,3>(0,0) = rotation;
  return transformation;
}